

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void PushWarnings(vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings,UniValue *obj)

{
  pointer pbVar1;
  UniValue val;
  UniValue val_00;
  pointer val_01;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffed8;
  undefined1 auVar2 [32];
  undefined1 in_stack_fffffffffffffef8 [56];
  undefined1 in_stack_ffffffffffffff30 [32];
  UniValue local_a8;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff38,"warnings",
               (allocator<char> *)&stack0xfffffffffffffedf);
    local_a8.typ._0_1_ =
         (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
         super__Vector_impl_data._M_start !=
         (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    inline_check_non_fatal<bool>
              ((bool *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
               ,0x55f,"BilingualStringsToUniValue","!bilingual_strings.empty()");
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    UniValue::UniValue((UniValue *)&stack0xfffffffffffffee0,VARR,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar1 = (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (val_01 = (warnings->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>).
                  _M_impl.super__Vector_impl_data._M_start; val_01 != pbVar1; val_01 = val_01 + 1) {
      UniValue::
      UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_a8,&val_01->original);
      val._32_56_ = in_stack_fffffffffffffef8;
      val._0_32_ = in_stack_fffffffffffffed8;
      UniValue::push_back((UniValue *)&stack0xfffffffffffffee0,val);
      UniValue::~UniValue(&local_a8);
    }
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff30._0_8_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_ffffffffffffff30._8_24_;
    auVar2 = in_stack_fffffffffffffef8._8_32_;
    val_00.typ = in_stack_fffffffffffffef8._0_4_;
    val_00._4_4_ = in_stack_fffffffffffffef8._4_4_;
    val_00.val._M_dataplus._M_p = (pointer)auVar2._0_8_;
    val_00.val._M_string_length = auVar2._8_8_;
    val_00.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar2._16_16_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffef8._40_8_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffef8._48_8_;
    UniValue::pushKV(obj,in_stack_fffffffffffffed8,val_00);
    UniValue::~UniValue((UniValue *)&stack0xfffffffffffffee0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PushWarnings(const std::vector<bilingual_str>& warnings, UniValue& obj)
{
    if (warnings.empty()) return;
    obj.pushKV("warnings", BilingualStringsToUniValue(warnings));
}